

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wwf.cpp
# Opt level: O1

void other_find_moves(void)

{
  char *pcVar1;
  int iVar2;
  
  iVar2 = rack_size;
  pcVar1 = rack;
  rack = my_rack;
  my_rack = pcVar1;
  rack_size = my_rack_size;
  my_rack_size = iVar2;
  find_moves();
  iVar2 = rack_size;
  pcVar1 = rack;
  rack_size = my_rack_size;
  my_rack_size = iVar2;
  rack = my_rack;
  my_rack = pcVar1;
  return;
}

Assistant:

void other_find_moves() {
    std::swap(rack, my_rack);
    std::swap(rack_size, my_rack_size);
    find_moves();
    std::swap(rack_size, my_rack_size);
    std::swap(rack, my_rack);
}